

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpec::ExcludedPattern::ExcludedPattern
          (ExcludedPattern *this,Ptr<Catch::TestSpec::Pattern> *underlyingPattern)

{
  Ptr<Catch::TestSpec::Pattern> *underlyingPattern_local;
  ExcludedPattern *this_local;
  
  Pattern::Pattern(&this->super_Pattern);
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__ExcludedPattern_002687b0;
  Ptr<Catch::TestSpec::Pattern>::Ptr(&this->m_underlyingPattern,underlyingPattern);
  return;
}

Assistant:

ExcludedPattern( Ptr<Pattern> const& underlyingPattern ) : m_underlyingPattern( underlyingPattern ) {}